

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceGaussianCurvatures
          (IntrinsicGeometryInterface *this)

{
  Corner e;
  Face e_00;
  bool bVar1;
  double *pdVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ParentMeshT *in_RDI;
  int i;
  Halfedge he;
  double angleDefect;
  Face f;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  FaceSet *__range2;
  MeshData<geometrycentral::surface::Face,_double> *in_stack_fffffffffffffdd8;
  SurfaceMesh *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  MeshData<geometrycentral::surface::Corner,_double> *in_stack_fffffffffffffdf0;
  ParentMeshT *in_stack_fffffffffffffe00;
  ParentMeshT *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe2c;
  undefined1 local_1b1 [161];
  string local_110 [32];
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_f0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_e0;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_d0;
  int local_bc;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_b8;
  MeshData<geometrycentral::surface::Face,_double> *local_a8;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_a0;
  undefined1 local_60 [24];
  undefined1 *local_48;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffde0);
  MeshData<geometrycentral::surface::Face,_double>::MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)
             CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
            );
  MeshData<geometrycentral::surface::Face,_double>::operator=
            ((MeshData<geometrycentral::surface::Face,_double> *)in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8);
  MeshData<geometrycentral::surface::Face,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)in_stack_fffffffffffffde0);
  SurfaceMesh::faces(in_stack_fffffffffffffde0);
  local_48 = local_60;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffde0);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffde0);
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffde0,
                       (RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffdd8);
    if (!bVar1) {
      return;
    }
    local_a0 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
               RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator*
                         ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)0x2a06ef);
    local_a8 = (MeshData<geometrycentral::surface::Face,_double> *)0xc00921fb54442d18;
    local_b8 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Face::halfedge((Face *)in_stack_fffffffffffffde0);
    for (local_bc = 0; local_bc < 3; local_bc = local_bc + 1) {
      in_stack_fffffffffffffdf0 =
           (MeshData<geometrycentral::surface::Corner,_double> *)
           &in_RDI[1].heEdgeArr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      local_d0 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
                 Halfedge::corner((Halfedge *)0x2a0763);
      e.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.ind =
           (size_t)in_stack_fffffffffffffe00;
      e.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.mesh
           = in_RDI;
      pdVar2 = MeshData<geometrycentral::surface::Corner,_double>::operator[]
                         (in_stack_fffffffffffffdf0,e);
      local_a8 = (MeshData<geometrycentral::surface::Face,_double> *)(*pdVar2 + (double)local_a8);
      local_e0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )Halfedge::next((Halfedge *)in_stack_fffffffffffffde0);
      local_b8 = local_e0;
    }
    local_f0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Face::halfedge((Face *)in_stack_fffffffffffffde0);
    bVar1 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            operator==(&local_b8,&local_f0);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    e_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)local_a0.mesh;
    e_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_RDI;
    in_stack_fffffffffffffdd8 = local_a8;
    in_stack_fffffffffffffe00 = local_a0.mesh;
    pdVar2 = MeshData<geometrycentral::surface::Face,_double>::operator[]
                       ((MeshData<geometrycentral::surface::Face,_double> *)
                        in_stack_fffffffffffffdf0,e_00);
    *pdVar2 = (double)in_stack_fffffffffffffdd8;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffde0)
    ;
  }
  uVar3 = 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_1b1 + 1),
             "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]nonmanifold-laplacian/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
             ,(allocator *)__lhs);
  ::std::operator+((char *)__lhs,__rhs);
  ::std::operator+(__lhs,(char *)__rhs);
  ::std::__cxx11::to_string(in_stack_fffffffffffffe2c);
  ::std::operator+(in_stack_fffffffffffffe18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_fffffffffffffe10));
  ::std::operator+(__lhs,(char *)__rhs);
  ::std::operator+(__lhs,(char *)__rhs);
  ::std::runtime_error::runtime_error((runtime_error *)__rhs,local_110);
  __cxa_throw(__rhs,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void IntrinsicGeometryInterface::computeFaceGaussianCurvatures() {
  cornerScaledAnglesQ.ensureHave();

  faceGaussianCurvatures = FaceData<double>(mesh);

  for (Face f : mesh.faces()) {

    double angleDefect = -PI;
    Halfedge he = f.halfedge();
    for (int i = 0; i < 3; i++) {
      angleDefect += cornerScaledAngles[he.corner()];
      he = he.next();
    }
    GC_SAFETY_ASSERT(he == f.halfedge(), "faces mush be triangular");

    faceGaussianCurvatures[f] = angleDefect;
  }
}